

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeSorterIterRead(sqlite3 *db,VdbeSorterIter *p,int nByte,u8 **ppOut)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  u8 *puVar4;
  long lVar5;
  long lVar6;
  size_t __n;
  int iVar7;
  long lVar8;
  int iVar9;
  u8 *aNext;
  int local_4c;
  u8 *local_38;
  
  lVar1 = p->iReadOff;
  lVar8 = (long)p->nBuffer;
  iVar3 = (int)(lVar1 / lVar8);
  lVar5 = lVar1 % lVar8;
  if (lVar5 == 0) {
    lVar6 = p->iEof - lVar1;
    iVar3 = (int)lVar6;
    if (lVar8 < lVar6) {
      iVar3 = p->nBuffer;
    }
    iVar3 = (*p->pFile->pMethods->xRead)(p->pFile,p->aBuffer,iVar3,lVar1);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  __n = (long)p->nBuffer - (long)(int)lVar5;
  iVar7 = nByte - (int)__n;
  if (iVar7 == 0 || nByte < (int)__n) {
    *ppOut = p->aBuffer + lVar5;
    p->iReadOff = p->iReadOff + (long)nByte;
    return 0;
  }
  iVar9 = p->nAlloc;
  if (iVar9 < nByte) {
    do {
      iVar9 = iVar9 * 2;
    } while (iVar9 < nByte);
    puVar4 = (u8 *)sqlite3DbReallocOrFree(db,p->aAlloc,iVar9);
    p->aAlloc = puVar4;
    if (puVar4 == (u8 *)0x0) {
      local_4c = 7;
LAB_001723d6:
      bVar2 = false;
      goto LAB_001723e8;
    }
    p->nAlloc = iVar9;
  }
  memcpy(p->aAlloc,p->aBuffer + lVar5,__n);
  p->iReadOff = p->iReadOff + __n;
  for (; 0 < iVar7; iVar7 = iVar7 - iVar9) {
    iVar9 = p->nBuffer;
    if (iVar7 < p->nBuffer) {
      iVar9 = iVar7;
    }
    local_4c = vdbeSorterIterRead(db,p,iVar9,&local_38);
    if (local_4c != 0) goto LAB_001723d6;
    memcpy(p->aAlloc + (nByte - iVar7),local_38,(long)iVar9);
  }
  *ppOut = p->aAlloc;
  bVar2 = true;
  local_4c = iVar3;
LAB_001723e8:
  if (bVar2) {
    return 0;
  }
  return local_4c;
}

Assistant:

static int vdbeSorterIterRead(
  sqlite3 *db,                    /* Database handle (for malloc) */
  VdbeSorterIter *p,              /* Iterator */
  int nByte,                      /* Bytes of data to read */
  u8 **ppOut                      /* OUT: Pointer to buffer containing data */
){
  int iBuf;                       /* Offset within buffer to read from */
  int nAvail;                     /* Bytes of data available in buffer */
  assert( p->aBuffer );

  /* If there is no more data to be read from the buffer, read the next 
  ** p->nBuffer bytes of data from the file into it. Or, if there are less
  ** than p->nBuffer bytes remaining in the PMA, read all remaining data.  */
  iBuf = p->iReadOff % p->nBuffer;
  if( iBuf==0 ){
    int nRead;                    /* Bytes to read from disk */
    int rc;                       /* sqlite3OsRead() return code */

    /* Determine how many bytes of data to read. */
    if( (p->iEof - p->iReadOff) > (i64)p->nBuffer ){
      nRead = p->nBuffer;
    }else{
      nRead = (int)(p->iEof - p->iReadOff);
    }
    assert( nRead>0 );

    /* Read data from the file. Return early if an error occurs. */
    rc = sqlite3OsRead(p->pFile, p->aBuffer, nRead, p->iReadOff);
    assert( rc!=SQLITE_IOERR_SHORT_READ );
    if( rc!=SQLITE_OK ) return rc;
  }
  nAvail = p->nBuffer - iBuf; 

  if( nByte<=nAvail ){
    /* The requested data is available in the in-memory buffer. In this
    ** case there is no need to make a copy of the data, just return a 
    ** pointer into the buffer to the caller.  */
    *ppOut = &p->aBuffer[iBuf];
    p->iReadOff += nByte;
  }else{
    /* The requested data is not all available in the in-memory buffer.
    ** In this case, allocate space at p->aAlloc[] to copy the requested
    ** range into. Then return a copy of pointer p->aAlloc to the caller.  */
    int nRem;                     /* Bytes remaining to copy */

    /* Extend the p->aAlloc[] allocation if required. */
    if( p->nAlloc<nByte ){
      int nNew = p->nAlloc*2;
      while( nByte>nNew ) nNew = nNew*2;
      p->aAlloc = sqlite3DbReallocOrFree(db, p->aAlloc, nNew);
      if( !p->aAlloc ) return SQLITE_NOMEM;
      p->nAlloc = nNew;
    }

    /* Copy as much data as is available in the buffer into the start of
    ** p->aAlloc[].  */
    memcpy(p->aAlloc, &p->aBuffer[iBuf], nAvail);
    p->iReadOff += nAvail;
    nRem = nByte - nAvail;

    /* The following loop copies up to p->nBuffer bytes per iteration into
    ** the p->aAlloc[] buffer.  */
    while( nRem>0 ){
      int rc;                     /* vdbeSorterIterRead() return code */
      int nCopy;                  /* Number of bytes to copy */
      u8 *aNext;                  /* Pointer to buffer to copy data from */

      nCopy = nRem;
      if( nRem>p->nBuffer ) nCopy = p->nBuffer;
      rc = vdbeSorterIterRead(db, p, nCopy, &aNext);
      if( rc!=SQLITE_OK ) return rc;
      assert( aNext!=p->aAlloc );
      memcpy(&p->aAlloc[nByte - nRem], aNext, nCopy);
      nRem -= nCopy;
    }

    *ppOut = p->aAlloc;
  }

  return SQLITE_OK;
}